

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_Thing_CanRaise(AActor *thing)

{
  uint uVar1;
  BYTE *pBVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  FState *pFVar7;
  undefined4 extraout_var;
  DVector2 local_20;
  
  pFVar7 = AActor::GetRaiseState(thing);
  if (pFVar7 == (FState *)0x0) {
    bVar5 = false;
  }
  else {
    if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar6 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
    }
    pBVar2 = ((thing->super_DThinker).super_DObject.Class)->Defaults;
    uVar1 = (thing->flags).Value;
    dVar3 = thing->radius;
    dVar4 = thing->Height;
    (thing->flags).Value = uVar1 | 2;
    thing->Height = *(double *)(pBVar2 + 0x180);
    thing->radius = *(double *)(pBVar2 + 0x178);
    local_20.X = (thing->__Pos).X;
    local_20.Y = (thing->__Pos).Y;
    bVar5 = P_CheckPosition(thing,&local_20,false);
    (thing->flags).Value = uVar1;
    thing->radius = dVar3;
    thing->Height = dVar4;
  }
  return bVar5;
}

Assistant:

bool P_Thing_CanRaise(AActor *thing)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return false;
	}
	
	AActor *info = thing->GetDefault();

	// Check against real height and radius
	ActorFlags oldflags = thing->flags;
	double oldheight = thing->Height;
	double oldradius = thing->radius;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;
	thing->radius = info->radius;

	bool check = P_CheckPosition (thing, thing->Pos());

	// Restore checked properties
	thing->flags = oldflags;
	thing->radius = oldradius;
	thing->Height = oldheight;

	if (!check)
	{
		return false;
	}

	return true;
}